

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::setLayoutQualifier
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TString *id,
          TIntermTyped *node)

{
  uint uVar1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  pointer pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  _func_int **pp_Var10;
  undefined1 uVar11;
  uint uVar12;
  size_type sVar13;
  
  integerCheck(this,node,"layout-id value");
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x11])(node);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)**(uint **)(*(long *)(CONCAT44(extraout_var,iVar3) + 0xc0) + 8);
  }
  sVar2 = id->_M_string_length;
  if (sVar2 != 0) {
    pcVar6 = (id->_M_dataplus)._M_p;
    sVar13 = 0;
    do {
      iVar3 = tolower((int)pcVar6[sVar13]);
      pcVar6[sVar13] = (char)iVar3;
      sVar13 = sVar13 + 1;
    } while (sVar2 != sVar13);
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"offset");
  uVar12 = (uint)uVar5;
  if (iVar3 == 0) {
    qualifier->layoutOffset = uVar12;
    return;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"align");
  if (iVar3 == 0) {
    if ((0 < (int)uVar12) && ((uVar12 + 0x7fffffff & uVar12) == 0)) {
      qualifier->layoutAlign = uVar12;
      return;
    }
    UNRECOVERED_JUMPTABLE_00 =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar8 = "must be a power of 2";
    pcVar7 = "align";
    goto LAB_0041dc8b;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"location");
  if (iVar3 == 0) {
    if (uVar12 < 0xfff) {
      *(ulong *)&qualifier->field_0x1c =
           *(ulong *)&qualifier->field_0x1c & 0xfffffffffffff000 | uVar5;
      return;
    }
    pcVar7 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE_00 =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar8 = "location is too large";
    goto LAB_0041dc8b;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"set");
  if (iVar3 == 0) {
    if (0x3e < uVar12) {
      pcVar7 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar8 = "set is too large";
      goto LAB_0041dc8b;
    }
    uVar5 = (ulong)(uVar12 << 0xf);
    uVar4 = 0xffffffffffc07fff;
LAB_0041d92d:
    *(ulong *)&qualifier->field_0x1c = uVar4 & *(ulong *)&qualifier->field_0x1c | uVar5;
    return;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"binding");
  if (iVar3 == 0) {
    if (0xfffe < uVar12) {
      pcVar7 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar8 = "binding is too large";
      goto LAB_0041dc8b;
    }
    uVar5 = uVar5 << 0x20;
    uVar4 = 0xffff0000ffffffff;
    goto LAB_0041d92d;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"component");
  if (iVar3 == 0) {
    if (3 < uVar12) {
      pcVar7 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar8 = "component is too large";
      goto LAB_0041dc8b;
    }
    uVar5 = (ulong)(uVar12 << 0xc);
    uVar4 = 0xffffffffffff8fff;
    goto LAB_0041d92d;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,0,4,"xfb_");
  if (iVar3 != 0) {
LAB_0041d6f3:
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"input_attachment_index");
    uVar11 = (undefined1)uVar5;
    if (iVar3 == 0) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2a])
                (this,loc,"input_attachment_index");
      if ((int)uVar12 < 0xff) {
        qualifier->field_0x28 = uVar11;
        return;
      }
      pcVar7 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar8 = "attachment index is too large";
      goto LAB_0041dc8b;
    }
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"constant_id");
    if (iVar3 == 0) {
      setSpecConstantId(this,loc,qualifier,uVar12);
      return;
    }
    switch((this->super_TParseContextBase).super_TParseVersions.language) {
    case EShLangTessControl:
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"vertices");
      if (iVar3 == 0) {
        if (uVar12 == 0) {
          UNRECOVERED_JUMPTABLE_00 =
               (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
          pcVar8 = "must be greater than 0";
          pcVar7 = "vertices";
          goto LAB_0041dc8b;
        }
LAB_0041dc66:
        pcVar7 = (id->_M_dataplus)._M_p;
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e];
        pcVar8 = "ignored";
        goto LAB_0041dc8b;
      }
      break;
    case EShLangGeometry:
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"invocations");
      if (iVar3 == 0) {
        if (uVar12 == 0) {
          UNRECOVERED_JUMPTABLE_00 =
               (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
          pcVar8 = "must be at least 1";
          pcVar7 = "invocations";
          goto LAB_0041dc8b;
        }
        goto LAB_0041dc66;
      }
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"max_vertices");
      if (iVar3 == 0) {
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                  (this,loc,"ignored",(id->_M_dataplus)._M_p,"");
        if ((int)uVar12 <= (this->super_TParseContextBase).resources.maxGeometryOutputVertices) {
          return;
        }
        UNRECOVERED_JUMPTABLE_00 =
             (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
        pcVar8 = "too large, must be less than gl_MaxGeometryOutputVertices";
        pcVar7 = "max_vertices";
        goto LAB_0041dc8b;
      }
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"stream");
      if (iVar3 == 0) {
        qualifier->field_0x23 = uVar11;
        return;
      }
      break;
    case EShLangFragment:
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,"index");
      if (iVar3 == 0) {
        qualifier->field_0x22 = uVar11;
        return;
      }
      break;
    case EShLangCompute:
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (id,0,0xb,"local_size_");
      if ((iVar3 == 0) &&
         ((((iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"local_size_x"), iVar3 == 0 ||
            (iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"local_size_y"), iVar3 == 0)) ||
           (iVar3 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(id,"local_size_z"), iVar3 == 0)) ||
          (((this->super_TParseContextBase).super_TParseVersions.spvVersion.spv != 0 &&
           (((iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"local_size_x_id"), iVar3 == 0 ||
             (iVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(id,"local_size_y_id"), iVar3 == 0)) ||
            (iVar3 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                     compare(id,"local_size_z_id"), iVar3 == 0)))))))) goto LAB_0041dc66;
    }
    pcVar7 = (id->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE_00 =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar8 = "there is no such layout identifier for this stage taking an assigned value";
LAB_0041dc8b:
    (*UNRECOVERED_JUMPTABLE_00)(this,loc,pcVar8,pcVar7,"",UNRECOVERED_JUMPTABLE_00);
    return;
  }
  ((this->super_TParseContextBase).super_TParseVersions.intermediate)->xfbMode = true;
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"xfb_buffer");
  if (iVar3 == 0) {
    if ((this->super_TParseContextBase).resources.maxTransformFeedbackBuffers <= (int)uVar12) {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"buffer is too large:",(id->_M_dataplus)._M_p,
                 "gl_MaxTransformFeedbackBuffers is %d");
    }
    if (0xe < (int)uVar12) {
      pcVar6 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "buffer is too large:";
      uVar9 = 0xe;
LAB_0041da6f:
      (*UNRECOVERED_JUMPTABLE_00)(this,loc,pcVar7,pcVar6,"internal max is %d",uVar9);
      return;
    }
    uVar12 = uVar12 & 0xf;
    uVar5 = *(ulong *)&qualifier->field_0x24 & 0xfffffffffffffff0;
    goto LAB_0041dbb3;
  }
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(id,"xfb_offset");
  if (iVar3 == 0) {
    if (0x1ffe < (int)uVar12) {
      pcVar6 = (id->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE_00 =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar7 = "offset is too large:";
      uVar9 = 0x1ffe;
      goto LAB_0041da6f;
    }
    uVar12 = (uVar12 & 0x1fff) << 0x12;
    uVar5 = 0xffffffff8003ffff;
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(id,"xfb_stride");
    if (iVar3 != 0) goto LAB_0041d6f3;
    uVar1 = (this->super_TParseContextBase).resources.maxTransformFeedbackInterleavedComponents;
    uVar5 = (ulong)uVar1;
    if ((int)(uVar1 * 4) < (int)uVar12) {
      pcVar6 = (id->_M_dataplus)._M_p;
      pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar7 = "1/4 stride is too large:";
      pcVar8 = "gl_MaxTransformFeedbackInterleavedComponents is %d";
LAB_0041db82:
      (*pp_Var10[0x2d])(this,loc,pcVar7,pcVar6,pcVar8,uVar5);
    }
    else if (0x3ffe < (int)uVar12) {
      pcVar6 = (id->_M_dataplus)._M_p;
      pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar7 = "stride is too large:";
      pcVar8 = "internal max is %d";
      uVar5 = 0x3ffe;
      goto LAB_0041db82;
    }
    if (0x3ffe < (int)uVar12) {
      return;
    }
    uVar12 = (uVar12 & 0x3fff) << 4;
    uVar5 = 0xfffffffffffc000f;
  }
  uVar5 = uVar5 & *(ulong *)&qualifier->field_0x24;
LAB_0041dbb3:
  *(ulong *)&qualifier->field_0x24 = uVar5 | uVar12;
  return;
}

Assistant:

void HlslParseContext::setLayoutQualifier(const TSourceLoc& loc, TQualifier& qualifier, TString& id,
                                          const TIntermTyped* node)
{
    const char* feature = "layout-id value";
    // const char* nonLiteralFeature = "non-literal layout-id value";

    integerCheck(node, feature);
    const TIntermConstantUnion* constUnion = node->getAsConstantUnion();
    int value = 0;
    if (constUnion) {
        value = constUnion->getConstArray()[0].getIConst();
    }

    std::transform(id.begin(), id.end(), id.begin(), ::tolower);

    if (id == "offset") {
        qualifier.layoutOffset = value;
        return;
    } else if (id == "align") {
        // "The specified alignment must be a power of 2, or a compile-time error results."
        if (! IsPow2(value))
            error(loc, "must be a power of 2", "align", "");
        else
            qualifier.layoutAlign = value;
        return;
    } else if (id == "location") {
        if ((unsigned int)value >= TQualifier::layoutLocationEnd)
            error(loc, "location is too large", id.c_str(), "");
        else
            qualifier.layoutLocation = value;
        return;
    } else if (id == "set") {
        if ((unsigned int)value >= TQualifier::layoutSetEnd)
            error(loc, "set is too large", id.c_str(), "");
        else
            qualifier.layoutSet = value;
        return;
    } else if (id == "binding") {
        if ((unsigned int)value >= TQualifier::layoutBindingEnd)
            error(loc, "binding is too large", id.c_str(), "");
        else
            qualifier.layoutBinding = value;
        return;
    } else if (id == "component") {
        if ((unsigned)value >= TQualifier::layoutComponentEnd)
            error(loc, "component is too large", id.c_str(), "");
        else
            qualifier.layoutComponent = value;
        return;
    } else if (id.compare(0, 4, "xfb_") == 0) {
        // "Any shader making any static use (after preprocessing) of any of these
        // *xfb_* qualifiers will cause the shader to be in a transform feedback
        // capturing mode and hence responsible for describing the transform feedback
        // setup."
        intermediate.setXfbMode();
        if (id == "xfb_buffer") {
            // "It is a compile-time error to specify an *xfb_buffer* that is greater than
            // the implementation-dependent constant gl_MaxTransformFeedbackBuffers."
            if (value >= resources.maxTransformFeedbackBuffers)
                error(loc, "buffer is too large:", id.c_str(), "gl_MaxTransformFeedbackBuffers is %d",
                      resources.maxTransformFeedbackBuffers);
            if (value >= (int)TQualifier::layoutXfbBufferEnd)
                error(loc, "buffer is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbBufferEnd - 1);
            else
                qualifier.layoutXfbBuffer = value;
            return;
        } else if (id == "xfb_offset") {
            if (value >= (int)TQualifier::layoutXfbOffsetEnd)
                error(loc, "offset is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbOffsetEnd - 1);
            else
                qualifier.layoutXfbOffset = value;
            return;
        } else if (id == "xfb_stride") {
            // "The resulting stride (implicit or explicit), when divided by 4, must be less than or equal to the
            // implementation-dependent constant gl_MaxTransformFeedbackInterleavedComponents."
            if (value > 4 * resources.maxTransformFeedbackInterleavedComponents)
                error(loc, "1/4 stride is too large:", id.c_str(), "gl_MaxTransformFeedbackInterleavedComponents is %d",
                      resources.maxTransformFeedbackInterleavedComponents);
            else if (value >= (int)TQualifier::layoutXfbStrideEnd)
                error(loc, "stride is too large:", id.c_str(), "internal max is %d", TQualifier::layoutXfbStrideEnd - 1);
            if (value < (int)TQualifier::layoutXfbStrideEnd)
                qualifier.layoutXfbStride = value;
            return;
        }
    }

    if (id == "input_attachment_index") {
        requireVulkan(loc, "input_attachment_index");
        if (value >= (int)TQualifier::layoutAttachmentEnd)
            error(loc, "attachment index is too large", id.c_str(), "");
        else
            qualifier.layoutAttachment = value;
        return;
    }
    if (id == "constant_id") {
        setSpecConstantId(loc, qualifier, value);
        return;
    }

    switch (language) {
    case EShLangVertex:
        break;

    case EShLangTessControl:
        if (id == "vertices") {
            if (value == 0)
                error(loc, "must be greater than 0", "vertices", "");
            else
                // publicType.shaderQualifiers.vertices = value;
                warn(loc, "ignored", id.c_str(), "");
            return;
        }
        break;

    case EShLangTessEvaluation:
        break;

    case EShLangGeometry:
        if (id == "invocations") {
            if (value == 0)
                error(loc, "must be at least 1", "invocations", "");
            else
                // publicType.shaderQualifiers.invocations = value;
                warn(loc, "ignored", id.c_str(), "");
            return;
        }
        if (id == "max_vertices") {
            // publicType.shaderQualifiers.vertices = value;
            warn(loc, "ignored", id.c_str(), "");
            if (value > resources.maxGeometryOutputVertices)
                error(loc, "too large, must be less than gl_MaxGeometryOutputVertices", "max_vertices", "");
            return;
        }
        if (id == "stream") {
            qualifier.layoutStream = value;
            return;
        }
        break;

    case EShLangFragment:
        if (id == "index") {
            qualifier.layoutIndex = value;
            return;
        }
        break;

    case EShLangCompute:
        if (id.compare(0, 11, "local_size_") == 0) {
            if (id == "local_size_x") {
                // publicType.shaderQualifiers.localSize[0] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == "local_size_y") {
                // publicType.shaderQualifiers.localSize[1] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (id == "local_size_z") {
                // publicType.shaderQualifiers.localSize[2] = value;
                warn(loc, "ignored", id.c_str(), "");
                return;
            }
            if (spvVersion.spv != 0) {
                if (id == "local_size_x_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[0] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
                if (id == "local_size_y_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[1] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
                if (id == "local_size_z_id") {
                    // publicType.shaderQualifiers.localSizeSpecId[2] = value;
                    warn(loc, "ignored", id.c_str(), "");
                    return;
                }
            }
        }
        break;

    default:
        break;
    }

    error(loc, "there is no such layout identifier for this stage taking an assigned value", id.c_str(), "");
}